

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::_internal_add_stride
          (ConvolutionLayerParams *this,uint64_t value)

{
  uint64_t local_18;
  uint64_t value_local;
  ConvolutionLayerParams *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->stride_,&local_18);
  return;
}

Assistant:

inline void ConvolutionLayerParams::_internal_add_stride(uint64_t value) {
  stride_.Add(value);
}